

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_link_resolver.c
# Opt level: O0

void archive_entry_linkresolver_free(archive_entry_linkresolver *res)

{
  archive_entry_linkresolver *in_RDI;
  links_entry *le;
  links_entry *in_stack_fffffffffffffff0;
  
  if (in_RDI != (archive_entry_linkresolver *)0x0) {
    while (in_stack_fffffffffffffff0 =
                next_entry(in_RDI,(int)((ulong)in_stack_fffffffffffffff0 >> 0x20)),
          in_stack_fffffffffffffff0 != (links_entry *)0x0) {
      archive_entry_free((archive_entry *)0x22b80d);
    }
    free(in_RDI->buckets);
    free(in_RDI);
  }
  return;
}

Assistant:

void
archive_entry_linkresolver_free(struct archive_entry_linkresolver *res)
{
	struct links_entry *le;

	if (res == NULL)
		return;

	while ((le = next_entry(res, NEXT_ENTRY_ALL)) != NULL)
		archive_entry_free(le->entry);
	free(res->buckets);
	free(res);
}